

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_engine.cpp
# Opt level: O0

int64_t __thiscall
spoa::AlignmentEngine::WorstCaseAlignmentScore(AlignmentEngine *this,int64_t i,int64_t j)

{
  char cVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  int64_t iVar5;
  int64_t iVar6;
  long local_38;
  long local_30;
  anon_class_8_1_8991fb9c local_28;
  anon_class_8_1_8991fb9c gap_score;
  int64_t j_local;
  int64_t i_local;
  AlignmentEngine *this_local;
  
  cVar1 = this->m_;
  local_28.this = this;
  gap_score.this = (AlignmentEngine *)j;
  j_local = i;
  i_local = (int64_t)this;
  plVar4 = std::min<long>(&j_local,(long *)&gap_score);
  lVar2 = *plVar4;
  iVar3 = std::abs((int)j_local - (int)gap_score.this);
  iVar5 = WorstCaseAlignmentScore::anon_class_8_1_8991fb9c::operator()
                    (&local_28,CONCAT44(extraout_var,iVar3));
  local_30 = -(cVar1 * lVar2 + iVar5);
  iVar5 = WorstCaseAlignmentScore::anon_class_8_1_8991fb9c::operator()(&local_28,j_local);
  iVar6 = WorstCaseAlignmentScore::anon_class_8_1_8991fb9c::operator()
                    (&local_28,(int64_t)gap_score.this);
  local_38 = iVar5 + iVar6;
  plVar4 = std::min<long>(&local_30,&local_38);
  return *plVar4;
}

Assistant:

std::int64_t AlignmentEngine::WorstCaseAlignmentScore(
    std::int64_t i,
    std::int64_t j) const {
  auto gap_score = [&] (std::int64_t len) -> std::int64_t {
    return len == 0 ? 0 : std::min(g_ + (len - 1) * e_, q_ + (len - 1) * c_);
  };
  return std::min(
      -1 * (m_ * std::min(i, j) + gap_score(std::abs(i - j))),
      gap_score(i) + gap_score(j));
}